

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageEdgeCircumcenterSign<double>
              (Vector3<double> *x0,Vector3<double> *x1,Vector3<double> *a,Vector3<double> *b,
              Vector3<double> *c,int abc_sign)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double z_error;
  Vector3<double> z;
  double local_40;
  Vector3<double> local_38;
  
  GetCircumcenter<double>(&local_38,a,b,c,&local_40);
  dVar4 = x0->c_[0] - x1->c_[0];
  dVar5 = x0->c_[1] - x1->c_[1];
  dVar8 = x0->c_[2] - x1->c_[2];
  dVar2 = x0->c_[0] + x1->c_[0];
  dVar7 = x0->c_[1] + x1->c_[1];
  dVar3 = x0->c_[2] + x1->c_[2];
  dVar6 = dVar5 * dVar3 - dVar7 * dVar8;
  dVar8 = dVar8 * dVar2 - dVar3 * dVar4;
  dVar3 = dVar7 * dVar4 - dVar2 * dVar5;
  dVar2 = local_38.c_[2] * local_38.c_[2] +
          local_38.c_[1] * local_38.c_[1] + local_38.c_[0] * local_38.c_[0];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar4 = (dVar3 * local_38.c_[2] + local_38.c_[1] * dVar8 + local_38.c_[0] * dVar6 + 0.0) *
          (double)abc_sign;
  dVar3 = dVar3 * dVar3 + dVar8 * dVar8 + dVar6 * dVar6;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar2 = dVar3 * local_40 +
          dVar2 * (dVar3 * 3.3306690738754696e-16 +
                  (dVar3 * 4.464101615137754 + 6.153480596427404e-15) * 1.1102230246251565e-16);
  iVar1 = 1;
  if (dVar4 <= dVar2) {
    iVar1 = -(uint)(dVar4 < -dVar2);
  }
  return iVar1;
}

Assistant:

int TriageEdgeCircumcenterSign(const Vector3<T>& x0, const Vector3<T>& x1,
                               const Vector3<T>& a, const Vector3<T>& b,
                               const Vector3<T>& c, int abc_sign) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Compute the circumcenter Z of triangle ABC, and then test which side of
  // edge X it lies on.
  T z_error;
  Vector3<T> z = GetCircumcenter(a, b, c, &z_error);
  Vector3<T> nx = (x0 - x1).CrossProd(x0 + x1);
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  T result = abc_sign * nx.DotProd(z);

  T z_len = z.Norm();
  T nx_len = nx.Norm();
  T nx_error = ((1 + 2 * sqrt(3)) * nx_len + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T result_error = ((3 * T_ERR * nx_len + nx_error) * z_len + z_error * nx_len);
  return (result > result_error) ? 1 : (result < -result_error) ? -1 : 0;
}